

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O2

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,IndexedMatrixArray *u,Vector *xh0,Matrix *p,
          Matrix *q,Matrix *r,double dt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_5b8;
  Matrix<double,__1,_1,_0,__1,_1> local_580;
  Vector dx;
  void *local_560 [7];
  Matrix a;
  Vector xhk;
  Matrix c;
  Vector3 local_4e8;
  IMUDynamicalSystem imuFunctor;
  ExtendedKalmanFilter filter;
  
  ExtendedKalmanFilter::ExtendedKalmanFilter(&filter,0x12,6,6,false,true);
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem(&imuFunctor);
  stateObservation::IMUDynamicalSystem::setSamplingPeriod(dt);
  stateObservation::ExtendedKalmanFilter::setFunctor((DynamicalSystemFunctorBase *)&filter);
  IndexedMatrixArray::getFirstIndex(y);
  stateObservation::ZeroDelayObserver::setState((Matrix *)&filter,(uint)xh0);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)&filter);
  uVar1 = IndexedMatrixArray::getFirstIndex(y);
  IndexedMatrixArray::operator[]((Matrix *)&local_5b8,u,uVar1 - 1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_560,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5b8);
  IndexedMatrixArray::getFirstIndex(y);
  stateObservation::ZeroDelayObserver::setInput((Matrix *)&filter,(uint)local_560);
  free(local_560[0]);
  free(local_5b8.m_lhs);
  stateObservation::KalmanFilterBase::setR((Matrix *)&filter);
  stateObservation::KalmanFilterBase::setQ((Matrix *)&filter);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3e45798ee2308c3a;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_5b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_560,(double *)&a);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&dx,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_5b8);
  free(local_560[0]);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5b8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0);
  uVar1 = IndexedMatrixArray::getFirstIndex(y);
  IndexedMatrixArray::setValue((IndexedMatrixArray *)this,(Matrix *)&local_5b8,uVar1 - 1);
  free(local_5b8.m_lhs);
  uVar1 = IndexedMatrixArray::getFirstIndex(y);
  while( true ) {
    uVar2 = IndexedMatrixArray::getLastIndex(y);
    if (uVar2 < uVar1) break;
    IndexedMatrixArray::operator[]((Matrix *)&local_5b8,y,uVar1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_560,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5b8);
    uVar3 = (uint)(PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_560;
    stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)&filter,uVar3);
    free(local_560[0]);
    free(local_5b8.m_lhs);
    uVar2 = IndexedMatrixArray::getLastIndex(y);
    if (uVar1 < uVar2) {
      IndexedMatrixArray::operator[]((Matrix *)&local_5b8,u,uVar1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_560,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5b8);
      stateObservation::ZeroDelayObserver::setInput((Matrix *)&filter,uVar3);
      free(local_560[0]);
      free(local_5b8.m_lhs);
    }
    stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&a);
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&c);
    stateObservation::KalmanFilterBase::setA((Matrix *)&filter);
    stateObservation::KalmanFilterBase::setC((Matrix *)&filter);
    uVar2 = (uint)(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xhk;
    stateObservation::ZeroDelayObserver::getEstimatedState(uVar2);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_5b8,
               (Matrix<double,__1,_1,_0,__1,_1> *)&xhk,3,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_4e8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_5b8);
    kine::regulateOrientationVector((kine *)&local_580,&local_4e8);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_560,
               (Matrix<double,__1,_1,_0,__1,_1> *)&xhk,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_560,&local_580);
    free(local_580.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    stateObservation::ZeroDelayObserver::setState((Matrix *)&filter,uVar2);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5b8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xhk);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)this,(Matrix *)&local_5b8,uVar1);
    free(local_5b8.m_lhs);
    free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    uVar1 = uVar1 + 1;
  }
  free(dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem(&imuFunctor);
  ExtendedKalmanFilter::~ExtendedKalmanFilter(&filter);
  return this;
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction
    (
    const IndexedMatrixArray & y,
    const IndexedMatrixArray & u,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=6;

    ///initialization of the extended Kalman filter
    ExtendedKalmanFilter filter(stateSize, measurementSize, inputSize, false);

    ///initalization of the functor
    IMUDynamicalSystem imuFunctor;
    imuFunctor.setSamplingPeriod(dt);
    filter.setFunctor(& imuFunctor);

    ///the initalization of the estimation of the initial state
    filter.setState(xh0,y.getFirstIndex()-1);

    ///computation and initialization of the covariance matrix of the initial state
    filter.setStateCovariance(p);

    ///set initial input
    filter.setInput(u[y.getFirstIndex()-1],y.getFirstIndex()-1);

    ///The covariance matrix of the process noise and the measurement noise
    /// for the extended Kalman filter
    filter.setR(r);
    filter.setQ(q);

    ///set the derivation step for the finite difference method
    Vector dx=filter.stateVectorConstant(1)*1e-8;

    ///the array of the state estimations over time
    IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        ///introduction of the measurement
        filter.setMeasurement(y[i],i);

        ///introduction of the input
        if (i<y.getLastIndex())
            filter.setInput(u[i],i);

        ///get the jacobians by finite differences and provide
        ///them to the Kalman filter
        Matrix a=filter.getAMatrixFD(dx);
        Matrix c= filter.getCMatrixFD(dx);
        filter.setA(a);
        filter.setC(c);

        ///get the estimation and give it to the array
        Vector xhk=filter.getEstimatedState(i);

        ///regulate the part of orientation vector in the state vector
        xhk.segment(kine::ori,3)=kine::regulateOrientationVector
                                                    (xhk.segment(kine::ori,3));

        ///give the new value of the state to the kalman filter.
        ///This step is usually unnecessary, unless we modify the
        ///value of the state esimation which is the case here.
        filter.setState(xhk,i);

        xh.setValue(xhk,i);
    }

    return xh;
}